

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O3

RC __thiscall QL_Manager::SetUpPrinter(QL_Manager *this,QL_Node *topNode,DataAttrInfo *attributes)

{
  char *pcVar1;
  char *pcVar2;
  int index;
  AttrCatEntry *pAVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  RC RVar7;
  int *piVar8;
  long lVar9;
  int attrListSize;
  int offset;
  int *attrList;
  int length;
  int local_48;
  int local_44;
  int *local_40;
  int local_34;
  
  RVar7 = QL_Node::GetAttrList(topNode,&local_40,&local_48);
  if (RVar7 == 0) {
    if (0 < local_48) {
      piVar8 = &attributes->indexNo;
      lVar9 = 0;
      do {
        index = local_40[lVar9];
        pAVar3 = this->attrEntries + index;
        uVar4 = *(undefined8 *)pAVar3->relName;
        uVar5 = *(undefined8 *)(pAVar3->relName + 8);
        pcVar1 = this->attrEntries[index].relName + 9;
        uVar6 = *(undefined8 *)(pcVar1 + 8);
        *(undefined8 *)((long)piVar8 + -0x37) = *(undefined8 *)pcVar1;
        *(undefined8 *)((long)piVar8 + -0x2f) = uVar6;
        *(undefined8 *)((DataAttrInfo *)(piVar8 + -0x10))->relName = uVar4;
        *(undefined8 *)(piVar8 + -0xe) = uVar5;
        pcVar1 = this->attrEntries[index].attrName;
        uVar4 = *(undefined8 *)(pcVar1 + 8);
        pcVar2 = this->attrEntries[index].attrName + 9;
        uVar5 = *(undefined8 *)pcVar2;
        uVar6 = *(undefined8 *)(pcVar2 + 8);
        *(undefined8 *)((long)piVar8 + -0x27) = *(undefined8 *)pcVar1;
        *(undefined8 *)((long)piVar8 + -0x1f) = uVar4;
        *(undefined8 *)((long)piVar8 + -0x1e) = uVar5;
        *(undefined8 *)((long)piVar8 + -0x16) = uVar6;
        pAVar3 = this->attrEntries;
        *(undefined8 *)(piVar8 + -2) = *(undefined8 *)&pAVar3[index].attrType;
        *piVar8 = pAVar3[index].indexNo;
        RVar7 = QL_Node::IndexToOffset(topNode,index,&local_44,&local_34);
        if (RVar7 != 0) {
          return RVar7;
        }
        piVar8[-3] = local_44;
        lVar9 = lVar9 + 1;
        piVar8 = piVar8 + 0x11;
      } while (lVar9 < local_48);
    }
    RVar7 = 0;
  }
  return RVar7;
}

Assistant:

RC QL_Manager::SetUpPrinter(QL_Node *topNode, DataAttrInfo *attributes){
  RC rc = 0;
  // Retrieve the attribute list from the top node
  int *attrList;
  int attrListSize;
  if((rc = topNode->GetAttrList(attrList, attrListSize)))
    return (rc);
  
  // Set up the attributes to print by tapping into attrEntries 
  for(int i=0; i < attrListSize; i++){
    int index = attrList[i];
    memcpy(attributes[i].relName, attrEntries[index].relName, MAXNAME + 1);
    memcpy(attributes[i].attrName, attrEntries[index].attrName, MAXNAME + 1);
    attributes[i].attrType = attrEntries[index].attrType;
    attributes[i].attrLength = attrEntries[index].attrLength;
    attributes[i].indexNo = attrEntries[index].indexNo;
    int offset, length;
    if((rc = topNode->IndexToOffset(index, offset, length)))
      return (rc);
    attributes[i].offset = offset;
  }

  return (0);
}